

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_c_binding.cpp
# Opt level: O0

uint32_t __thiscall
basis_file::getImageHeight(basis_file *this,uint32_t image_index,uint32_t level_index)

{
  ulong uVar1;
  uint in_EDX;
  uint in_ESI;
  int *in_RDI;
  uint32_t total_blocks;
  uint32_t orig_height;
  uint32_t orig_width;
  uint32_t local_20;
  uint local_1c [6];
  uint32_t local_4;
  
  if (*in_RDI == -0x2152411f) {
    if (*in_RDI == -0x2152411f) {
      uVar1 = basist::basisu_transcoder::get_image_level_desc
                        (in_RDI + 2,(uint)*(undefined8 *)(in_RDI + 200),in_RDI[0xca],in_ESI,
                         (uint *)(ulong)in_EDX,local_1c,&local_20);
      if ((uVar1 & 1) == 0) {
        local_4 = 0;
      }
      else {
        local_4 = local_20;
      }
    }
    else {
      local_4 = 0;
    }
    return local_4;
  }
  __assert_fail("m_magic == MAGIC",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/interface/basisu_c_binding/src/basisu_c_binding.cpp"
                ,0x4f,"uint32_t basis_file::getImageHeight(uint32_t, uint32_t)");
}

Assistant:

uint32_t basis_file::getImageHeight(uint32_t image_index, uint32_t level_index) {
    assert(m_magic == MAGIC);
    if (m_magic != MAGIC)
        return 0;

    uint32_t orig_width, orig_height, total_blocks;
    if (!m_transcoder.get_image_level_desc(m_file, byteLength,
                                           image_index, level_index,
                                           orig_width, orig_height,
                                           total_blocks))
        return 0;

    return orig_height;
}